

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationErrorHandler.cpp
# Opt level: O0

bool __thiscall ValidationErrorHandler::handleError(ValidationErrorHandler *this,IError *error)

{
  int iVar1;
  ErrorType EVar2;
  char *pcVar3;
  ostream *poVar4;
  String *pSVar5;
  SaxFWLError *in_RSI;
  long in_RDI;
  SaxFWLError *saxFWLError;
  ParserError *parserError;
  SaxParserError *saxParserError;
  ParserError *in_stack_00000178;
  string local_48 [32];
  ParserError *local_28;
  SaxFWLError *local_20;
  SaxFWLError *local_18;
  
  local_18 = in_RSI;
  iVar1 = (*(in_RSI->super_IError)._vptr_IError[2])();
  if (iVar1 == 0) {
    local_20 = local_18;
    local_28 = COLLADASaxFWL::SaxParserError::getError((SaxParserError *)local_18);
    EVar2 = GeneratedSaxParser::ParserError::getErrorType(local_28);
    if (EVar2 == ERROR_VALIDATION_MIN_OCCURS_UNMATCHED) {
      pcVar3 = GeneratedSaxParser::ParserError::getElement(local_28);
      iVar1 = strcmp(pcVar3,"effect");
      if (iVar1 == 0) {
        return false;
      }
    }
    EVar2 = GeneratedSaxParser::ParserError::getErrorType(local_28);
    if (EVar2 == ERROR_VALIDATION_SEQUENCE_PREVIOUS_SIBLING_NOT_PRESENT) {
      pcVar3 = GeneratedSaxParser::ParserError::getElement(local_28);
      iVar1 = strcmp(pcVar3,"extra");
      if (iVar1 == 0) {
        GeneratedSaxParser::ParserError::getAdditionalText_abi_cxx11_(local_28);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar1 = strcmp(pcVar3,"sibling: fx_profile_abstract");
        if (iVar1 == 0) {
          return false;
        }
      }
    }
    EVar2 = GeneratedSaxParser::ParserError::getErrorType(local_28);
    if (EVar2 == ERROR_COULD_NOT_OPEN_FILE) {
      *(undefined1 *)(in_RDI + 10) = 1;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Schema validation error: ");
    GeneratedSaxParser::ParserError::getErrorMessage_abi_cxx11_(in_stack_00000178);
    poVar4 = std::operator<<(poVar4,local_48);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_48);
    *(undefined1 *)(in_RDI + 8) = 1;
  }
  else {
    iVar1 = (*(local_18->super_IError)._vptr_IError[2])();
    if (iVar1 == 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Sax FWL Error: ");
      pSVar5 = COLLADASaxFWL::SaxFWLError::getErrorMessage_abi_cxx11_(local_18);
      poVar4 = std::operator<<(poVar4,(string *)pSVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      *(undefined1 *)(in_RDI + 9) = 1;
    }
  }
  return false;
}

Assistant:

bool ValidationErrorHandler::handleError( const COLLADASaxFWL::IError* error )
{
	if ( error->getErrorClass() == COLLADASaxFWL::IError::ERROR_SAXPARSER )
	{
		COLLADASaxFWL::SaxParserError* saxParserError = (COLLADASaxFWL::SaxParserError*) error;
		const GeneratedSaxParser::ParserError& parserError = saxParserError->getError();

		// Workaround to avoid wrong error
		if ( parserError.getErrorType() == GeneratedSaxParser::ParserError::ERROR_VALIDATION_MIN_OCCURS_UNMATCHED)
		{
			if ( strcmp(parserError.getElement(), "effect") == 0 )
			{
				return false;
			}
		}
		if ( parserError.getErrorType() == GeneratedSaxParser::ParserError::ERROR_VALIDATION_SEQUENCE_PREVIOUS_SIBLING_NOT_PRESENT)
		{
			if ( (strcmp(parserError.getElement(), "extra") == 0) 
				&& (strcmp(parserError.getAdditionalText().c_str(), "sibling: fx_profile_abstract") == 0)) 
			{

				return false;
			}
		}

		if ( parserError.getErrorType() == GeneratedSaxParser::ParserError::ERROR_COULD_NOT_OPEN_FILE)
		{
			mFileNotFound = true;
		}

		std::cout << "Schema validation error: " << parserError.getErrorMessage() << std::endl;
		mHasHandledSaxParserError = true;
	}
	else if ( error->getErrorClass() == COLLADASaxFWL::IError::ERROR_SAXFWL )
	{
		COLLADASaxFWL::SaxFWLError* saxFWLError = (COLLADASaxFWL::SaxFWLError*) error;
		std::cout << "Sax FWL Error: " << saxFWLError->getErrorMessage() << std::endl;
		mHasHandledSaxFWLError = true;
	}
	return false;
}